

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O0

map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_> *
__thiscall node::MiniMiner::CalculateBumpFees(MiniMiner *this,CFeeRate *target_feerate)

{
  long lVar1;
  bool bVar2;
  pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_> *in_RDX;
  byte *in_RSI;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  optional<CFeeRate> in_stack_00000040;
  COutPoint *outpoint_1;
  type *__range3_1;
  type *outpoints;
  type *txid_1;
  map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
  *__range1_1;
  COutPoint *outpoint;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range3;
  uint256 *txid;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *__range1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  CAmount bump_fee;
  CAmount bump_fee_individual;
  CAmount bump_fee_with_ancestors;
  iterator it_1;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end3;
  iterator __begin3;
  iterator it;
  iterator __end1;
  iterator __begin1;
  pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
  *in_stack_fffffffffffffe58;
  map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
  *in_stack_fffffffffffffe60;
  pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
  *in_stack_fffffffffffffe68;
  int line;
  COutPoint *in_stack_fffffffffffffe70;
  uint32_t num_bytes;
  iterator in_stack_fffffffffffffe78;
  MiniMiner *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RSI & 1) == 0) {
    memset(in_RDI,0,0x30);
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)in_stack_fffffffffffffe58);
  }
  else {
    std::optional<CFeeRate>::optional<const_CFeeRate_&,_true>
              ((optional<CFeeRate> *)in_stack_fffffffffffffe68,(CFeeRate *)in_stack_fffffffffffffe60
              );
    BuildMockTemplate(in_stack_ffffffffffffff80,in_stack_00000040);
    std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::begin
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
               in_stack_fffffffffffffe60);
    std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::end
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
               in_stack_fffffffffffffe60);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,
                                   (_Self *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      std::_Rb_tree_const_iterator<uint256>::operator*
                ((_Rb_tree_const_iterator<uint256> *)in_stack_fffffffffffffe58);
      std::
      map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::find(in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->first);
      std::
      map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::end(in_stack_fffffffffffffe60);
      bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,(_Self *)in_stack_fffffffffffffe60)
      ;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::
        _Rb_tree_iterator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>
                      *)in_stack_fffffffffffffe58);
        std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
                  ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffe60);
        std::vector<COutPoint,_std::allocator<COutPoint>_>::end
                  ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffe60);
        while (bVar2 = __gnu_cxx::
                       operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                                 ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                                   *)in_stack_fffffffffffffe68,
                                  (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                                   *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
          operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                     *)in_stack_fffffffffffffe58);
          std::
          map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>::
          emplace<COutPoint_const&,int>
                    ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)in_stack_fffffffffffffe78._M_node,in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68);
          __gnu_cxx::
          __normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
          operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                      *)in_stack_fffffffffffffe58);
        }
        std::
        map<uint256,std::vector<COutPoint,std::allocator<COutPoint>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>>>
        ::erase_abi_cxx11_(in_stack_fffffffffffffe60,in_stack_fffffffffffffe78);
      }
      std::_Rb_tree_const_iterator<uint256>::operator++
                ((_Rb_tree_const_iterator<uint256> *)in_stack_fffffffffffffe58);
    }
    std::
    map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
    ::begin(in_stack_fffffffffffffe60);
    std::
    map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
    ::end(in_stack_fffffffffffffe60);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,
                                   (_Self *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_iterator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>
                   *)in_stack_fffffffffffffe58);
      std::get<0ul,uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>
                (in_stack_fffffffffffffe58);
      std::get<1ul,uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>
                (in_stack_fffffffffffffe58);
      std::
      map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::find((map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
              *)in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->first);
      std::
      map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::end((map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
             *)in_stack_fffffffffffffe60);
      std::operator==((_Self *)in_stack_fffffffffffffe68,(_Self *)in_stack_fffffffffffffe60);
      inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffffe78._M_node,(char *)in_stack_fffffffffffffe70,
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(char *)in_stack_fffffffffffffe60,
                 (char *)in_stack_fffffffffffffe58);
      std::
      map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::end((map<uint256,_node::MiniMinerMempoolEntry,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
             *)in_stack_fffffffffffffe60);
      bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,(_Self *)in_stack_fffffffffffffe60)
      ;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffffe58 = in_RDX;
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_RDX);
        line = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
        MiniMinerMempoolEntry::GetSizeWithAncestors
                  ((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe60 =
             (map<uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
              *)CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffe78._M_node,
                                 (uint32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_stack_fffffffffffffe58);
        MiniMinerMempoolEntry::GetModifiedFee((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_stack_fffffffffffffe58);
        MiniMinerMempoolEntry::GetModFeesWithAncestors
                  ((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        std::min<long>((long *)in_stack_fffffffffffffe60,(long *)in_stack_fffffffffffffe58);
        inline_assertion_check<false,bool>
                  ((bool *)in_stack_fffffffffffffe78._M_node,(char *)in_stack_fffffffffffffe70,line,
                   (char *)in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
        num_bytes = (uint32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20);
        in_stack_fffffffffffffe68 = in_RDX;
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_stack_fffffffffffffe58);
        MiniMinerMempoolEntry::GetSizeWithAncestors
                  ((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe70 =
             (COutPoint *)CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffe78._M_node,num_bytes);
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_stack_fffffffffffffe58);
        MiniMinerMempoolEntry::GetModFeesWithAncestors
                  ((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe78._M_node = (_Base_ptr)in_RDX;
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_stack_fffffffffffffe58);
        MiniMinerMempoolEntry::GetTxSize((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffe78._M_node,
                         (uint32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                   in_stack_fffffffffffffe58);
        MiniMinerMempoolEntry::GetModifiedFee((MiniMinerMempoolEntry *)in_stack_fffffffffffffe58);
        std::max<long>((long *)in_stack_fffffffffffffe60,(long *)in_stack_fffffffffffffe58);
        inline_assertion_check<false,bool>
                  ((bool *)in_stack_fffffffffffffe78._M_node,(char *)in_stack_fffffffffffffe70,
                   (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(char *)in_stack_fffffffffffffe60
                   ,(char *)in_stack_fffffffffffffe58);
        std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
                  ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffe60);
        std::vector<COutPoint,_std::allocator<COutPoint>_>::end
                  ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffe60);
        while (bVar2 = __gnu_cxx::
                       operator==<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                                 ((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                                   *)in_stack_fffffffffffffe68,
                                  (__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                                   *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
          ::operator*((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                       *)in_stack_fffffffffffffe58);
          std::
          map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>::
          emplace<COutPoint_const&,long_const&>
                    ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)in_stack_fffffffffffffe78._M_node,in_stack_fffffffffffffe70,
                     (long *)in_stack_fffffffffffffe68);
          __gnu_cxx::
          __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
          ::operator++((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                        *)in_stack_fffffffffffffe58);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>
                    *)in_stack_fffffffffffffe58);
    }
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)in_stack_fffffffffffffe58,
        (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)0x4c2780);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::map<COutPoint, CAmount> MiniMiner::CalculateBumpFees(const CFeeRate& target_feerate)
{
    if (!m_ready_to_calculate) return {};
    // Build a block template until the target feerate is hit.
    BuildMockTemplate(target_feerate);

    // Each transaction that "made it into the block" has a bumpfee of 0, i.e. they are part of an
    // ancestor package with at least the target feerate and don't need to be bumped.
    for (const auto& txid : m_in_block) {
        // Not all of the block transactions were necessarily requested.
        auto it = m_requested_outpoints_by_txid.find(txid);
        if (it != m_requested_outpoints_by_txid.end()) {
            for (const auto& outpoint : it->second) {
                m_bump_fees.emplace(outpoint, 0);
            }
            m_requested_outpoints_by_txid.erase(it);
        }
    }

    // A transactions and its ancestors will only be picked into a block when
    // both the ancestor set feerate and the individual feerate meet the target
    // feerate.
    //
    // We had to convince ourselves that after running the mini miner and
    // picking all eligible transactions into our MockBlockTemplate, there
    // could still be transactions remaining that have a lower individual
    // feerate than their ancestor feerate. So here is an example:
    //
    //               ┌─────────────────┐
    //               │                 │
    //               │   Grandparent   │
    //               │    1700 vB      │
    //               │    1700 sats    │                    Target feerate: 10    s/vB
    //               │       1 s/vB    │    GP Ancestor Set Feerate (ASFR):  1    s/vB
    //               │                 │                           P1_ASFR:  9.84 s/vB
    //               └──────▲───▲──────┘                           P2_ASFR:  2.47 s/vB
    //                      │   │                                   C_ASFR: 10.27 s/vB
    // ┌───────────────┐    │   │    ┌──────────────┐
    // │               ├────┘   └────┤              │             ⇒ C_FR < TFR < C_ASFR
    // │   Parent 1    │             │   Parent 2   │
    // │    200 vB     │             │    200 vB    │
    // │  17000 sats   │             │   3000 sats  │
    // │     85 s/vB   │             │     15 s/vB  │
    // │               │             │              │
    // └───────────▲───┘             └───▲──────────┘
    //             │                     │
    //             │    ┌───────────┐    │
    //             └────┤           ├────┘
    //                  │   Child   │
    //                  │  100 vB   │
    //                  │  900 sats │
    //                  │    9 s/vB │
    //                  │           │
    //                  └───────────┘
    //
    // We therefore calculate both the bump fee that is necessary to elevate
    // the individual transaction to the target feerate:
    //         target_feerate × tx_size - tx_fees
    // and the bump fee that is necessary to bump the entire ancestor set to
    // the target feerate:
    //         target_feerate × ancestor_set_size - ancestor_set_fees
    // By picking the maximum from the two, we ensure that a transaction meets
    // both criteria.
    for (const auto& [txid, outpoints] : m_requested_outpoints_by_txid) {
        auto it = m_entries_by_txid.find(txid);
        Assume(it != m_entries_by_txid.end());
        if (it != m_entries_by_txid.end()) {
            Assume(target_feerate.GetFee(it->second.GetSizeWithAncestors()) > std::min(it->second.GetModifiedFee(), it->second.GetModFeesWithAncestors()));
            CAmount bump_fee_with_ancestors = target_feerate.GetFee(it->second.GetSizeWithAncestors()) - it->second.GetModFeesWithAncestors();
            CAmount bump_fee_individual = target_feerate.GetFee(it->second.GetTxSize()) - it->second.GetModifiedFee();
            const CAmount bump_fee{std::max(bump_fee_with_ancestors, bump_fee_individual)};
            Assume(bump_fee >= 0);
            for (const auto& outpoint : outpoints) {
                m_bump_fees.emplace(outpoint, bump_fee);
            }
        }
    }
    return m_bump_fees;
}